

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::Decode
          (UnderwaterAcousticEmitterSystem *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  byte bVar2;
  allocator<char> local_59;
  UnderwaterAcousticEmitterBeam UAEB;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x13 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8EmitterSystemDataLength);
    KDataStream::Read(stream,&this->m_ui8NumBeams);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
    (*(this->m_AES).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AES,stream);
    (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
    std::
    vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
    ::clear(&this->m_vUAEB);
    for (bVar2 = 0; bVar2 < this->m_ui8NumBeams; bVar2 = bVar2 + 1) {
      UnderwaterAcousticEmitterBeam::UnderwaterAcousticEmitterBeam(&UAEB);
      (*UAEB.super_DataTypeBase._vptr_DataTypeBase[3])(&UAEB,stream);
      std::
      vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
      ::push_back(&this->m_vUAEB,&UAEB);
      UnderwaterAcousticEmitterBeam::~UnderwaterAcousticEmitterBeam(&UAEB);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&UAEB,"Decode",&local_59);
  KException::KException(this_00,(KString *)&UAEB,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void UnderwaterAcousticEmitterSystem::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EmitterSystemDataLength
           >> m_ui8NumBeams
           >> m_ui16Padding1
           >> KDIS_STREAM m_AES
           >> KDIS_STREAM m_Location;

    m_vUAEB.clear();

    for( KUINT8 i = 0; i < m_ui8NumBeams; ++i )
    {
        UnderwaterAcousticEmitterBeam UAEB;
        stream >> KDIS_STREAM UAEB;
        m_vUAEB.push_back( UAEB );
    }
}